

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O0

void __thiscall
QStandardItemPrivate::setItemData(QStandardItemPrivate *this,QMap<int,_QVariant> *roles)

{
  long lVar1;
  key_iterator o;
  compare_eq_result_container<QList<QStandardItemData>,_QStandardItemData> cVar2;
  bool bVar3;
  iterator iVar4;
  iterator iVar5;
  const_key_value_iterator cVar6;
  const_iterator item;
  const_iterator cVar7;
  const_iterator this_00;
  back_insert_iterator<QList<QStandardItemData>_> bVar8;
  int *piVar9;
  qsizetype in_RSI;
  QStandardItemPrivate *in_RDI;
  long in_FS_OFFSET;
  bool hasDisplayRole;
  bool hasEditRole;
  QStandardItem *q;
  key_iterator it;
  QList<int> roleKeys;
  QList<QStandardItemData> newValues;
  anon_class_1_0_00000001 byRole;
  parameter_type t;
  const_iterator in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff48;
  byte bVar10;
  byte bVar11;
  QStandardItemModelPrivate *in_stack_ffffffffffffff58;
  QList<QStandardItemData> *in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  iVar4 = QList<QStandardItemData>::begin
                    ((QList<QStandardItemData> *)in_stack_ffffffffffffff40._M_node);
  iVar5 = QList<QStandardItemData>::end
                    ((QList<QStandardItemData> *)in_stack_ffffffffffffff40._M_node);
  std::
  sort<QList<QStandardItemData>::iterator,QStandardItemPrivate::setItemData(QMap<int,QVariant>const&)::__0>
            (iVar4.i,iVar5.i);
  QList<QStandardItemData>::QList((QList<QStandardItemData> *)0x8cda83);
  QList<QStandardItemData>::size(&in_RDI->values);
  QList<QStandardItemData>::reserve(in_stack_ffffffffffffff68,in_RSI);
  cVar6 = QMap<int,_QVariant>::keyValueBegin
                    ((QMap<int,_QVariant> *)in_stack_ffffffffffffff40._M_node);
  item._M_node = (_Base_ptr)QMap<int,_QVariant>::keyValueEnd(in_stack_ffffffffffffff40._M_node);
  cVar7 = QList<QStandardItemData>::cbegin
                    ((QList<QStandardItemData> *)in_stack_ffffffffffffff40._M_node);
  this_00 = QList<QStandardItemData>::cend
                      ((QList<QStandardItemData> *)in_stack_ffffffffffffff40._M_node);
  bVar8 = std::back_inserter<QList<QStandardItemData>>
                    ((QList<QStandardItemData> *)in_stack_ffffffffffffff40._M_node);
  bVar8 = (anonymous_namespace)::
          roleMapStandardItemDataUnion<QKeyValueIterator<int_const&,QVariant_const&,QMap<int,QVariant>::const_iterator>,QList<QStandardItemData>::const_iterator,std::back_insert_iterator<QList<QStandardItemData>>,(anonymous_namespace)::ByNormalizedRole>
                    (cVar6.i.i._M_node,item._M_node,cVar7.i,this_00.i,bVar8.container);
  cVar2 = QList<QStandardItemData>::operator!=
                    ((QList<QStandardItemData> *)in_stack_ffffffffffffff40._M_node,
                     (QList<QStandardItemData> *)in_RDI);
  if ((cVar2) &&
     (QList<QStandardItemData>::swap
                ((QList<QStandardItemData> *)in_stack_ffffffffffffff40._M_node,
                 (QList<QStandardItemData> *)in_RDI), in_RDI->model != (QStandardItemModel *)0x0)) {
    QList<int>::QList((QList<int> *)0x8cdb92);
    QMap<int,_QVariant>::size((QMap<int,_QVariant> *)in_stack_ffffffffffffff40._M_node);
    QList<int>::reserve((QList<int> *)this_00.i,in_RSI);
    bVar11 = 0;
    bVar10 = 0;
    QMap<int,_QVariant>::keyBegin((QMap<int,_QVariant> *)in_stack_ffffffffffffff40._M_node);
    while( true ) {
      in_stack_ffffffffffffff40._M_node =
           (_Base_ptr)QMap<int,_QVariant>::keyEnd(in_stack_ffffffffffffff40._M_node);
      o.i.i._M_node._6_1_ = bVar10;
      o.i.i._M_node._0_6_ = in_stack_ffffffffffffff48;
      o.i.i._M_node._7_1_ = bVar11;
      bVar3 = QMap<int,_QVariant>::key_iterator::operator!=
                        ((key_iterator *)in_stack_ffffffffffffff40._M_node,o);
      if (!bVar3) break;
      QMap<int,_QVariant>::key_iterator::operator*((key_iterator *)0x8cdc0f);
      QList<int>::push_back
                ((QList<int> *)in_stack_ffffffffffffff40._M_node,
                 (parameter_type)((ulong)in_RDI >> 0x20));
      piVar9 = QMap<int,_QVariant>::key_iterator::operator*((key_iterator *)0x8cdc2b);
      if (*piVar9 == 2) {
        bVar11 = 1;
      }
      else {
        piVar9 = QMap<int,_QVariant>::key_iterator::operator*((key_iterator *)0x8cdc44);
        if (*piVar9 == 0) {
          bVar10 = 1;
        }
      }
      QMap<int,_QVariant>::key_iterator::operator++
                ((key_iterator *)in_stack_ffffffffffffff40._M_node);
    }
    t = (parameter_type)((ulong)in_RDI >> 0x20);
    if (((bVar11 & 1) == 0) || ((bVar10 & 1) != 0)) {
      if (((bVar11 & 1) == 0) && ((bVar10 & 1) != 0)) {
        QList<int>::push_back((QList<int> *)in_stack_ffffffffffffff40._M_node,t);
      }
    }
    else {
      QList<int>::push_back((QList<int> *)in_stack_ffffffffffffff40._M_node,t);
    }
    QStandardItemModel::d_func((QStandardItemModel *)0x8cdcb1);
    QStandardItemModelPrivate::itemChanged
              (in_stack_ffffffffffffff58,(QStandardItem *)item._M_node,(QList<int> *)bVar8.container
              );
    QList<int>::~QList((QList<int> *)0x8cdcd3);
  }
  QList<QStandardItemData>::~QList((QList<QStandardItemData> *)0x8cdce2);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStandardItemPrivate::setItemData(const QMap<int, QVariant> &roles)
{
    Q_Q(QStandardItem);

    auto byRole = [](const QStandardItemData& item1, const QStandardItemData& item2) {
        return item1.role < item2.role;
    };

    std::sort(values.begin(), values.end(), byRole);

    /*
        Create a list of QStandardItemData that will contain the original values
        if the matching role is not contained in roles, the new value if it is and
        if the new value is an invalid QVariant, it will be removed.
    */
    QList<QStandardItemData> newValues;
    newValues.reserve(values.size());
    roleMapStandardItemDataUnion(roles.keyValueBegin(),
                                 roles.keyValueEnd(),
                                 values.cbegin(), values.cend(),
                                 std::back_inserter(newValues), ByNormalizedRole());

    if (newValues != values) {
        values.swap(newValues);
        if (model) {
            QList<int> roleKeys;
            roleKeys.reserve(roles.size() + 1);
            bool hasEditRole = false;
            bool hasDisplayRole = false;
            for (auto it = roles.keyBegin(); it != roles.keyEnd(); ++it) {
                roleKeys.push_back(*it);
                if (*it == Qt::EditRole)
                    hasEditRole = true;
                else if (*it == Qt::DisplayRole)
                    hasDisplayRole = true;
            }
            if (hasEditRole && !hasDisplayRole)
                roleKeys.push_back(Qt::DisplayRole);
            else if (!hasEditRole && hasDisplayRole)
                roleKeys.push_back(Qt::EditRole);
            model->d_func()->itemChanged(q, roleKeys);
        }
    }
}